

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanced_geometry.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  TutorialBenchmark *in_stack_fffffffffffffba0;
  char **in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbd4;
  TutorialApplication *in_stack_fffffffffffffbd8;
  char **in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf0;
  Tutorial *in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffcb8;
  char **in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffccc;
  TutorialBenchmark *in_stack_fffffffffffffcd0;
  BenchFunc in_stack_fffffffffffffee8;
  TutorialBenchmark *in_stack_fffffffffffffef0;
  allocator local_f9;
  string local_f8 [244];
  int local_4;
  
  local_4 = 0;
  bVar1 = embree::TutorialBenchmark::benchmark(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  if (bVar1) {
    embree::TutorialBenchmark::TutorialBenchmark
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"instanced_geometry",&local_f9);
    local_4 = embree::TutorialBenchmark::main
                        (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,
                         in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    embree::TutorialBenchmark::~TutorialBenchmark(in_stack_fffffffffffffba0);
  }
  else {
    embree::Tutorial::Tutorial(in_stack_fffffffffffffbf8);
    local_4 = embree::TutorialApplication::main
                        (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                         in_stack_fffffffffffffbc8);
    embree::Tutorial::~Tutorial((Tutorial *)0x11bbd8);
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  if (embree::TutorialBenchmark::benchmark(argc, argv)) {
    return embree::TutorialBenchmark(embree::renderBenchFunc<embree::Tutorial>).main(argc, argv, "instanced_geometry");
  }
  return embree::Tutorial().main(argc,argv);
}